

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# arkode_mristep.c
# Opt level: O2

int mriStep_TakeStep(void *arkode_mem,realtype *dsmPtr,int *nflagPtr)

{
  int iVar1;
  int *piVar2;
  ARKodeMRIStepMem *step_mem_00;
  undefined8 extraout_RDX;
  undefined8 extraout_RDX_00;
  undefined8 extraout_RDX_01;
  undefined8 extraout_RDX_02;
  undefined8 extraout_RDX_03;
  undefined8 extraout_RDX_04;
  undefined8 extraout_RDX_05;
  undefined8 extraout_RDX_06;
  undefined8 extraout_RDX_07;
  undefined8 extraout_RDX_08;
  undefined8 extraout_RDX_09;
  undefined8 uVar3;
  char *step_mem_01;
  ulong uVar4;
  ARKodeMem ark_mem;
  realtype *local_40;
  ARKodeMRIStepMem step_mem;
  
  *nflagPtr = 0;
  *dsmPtr = 0.0;
  step_mem_01 = "mriStep_TakeStep";
  step_mem_00 = &step_mem;
  local_40 = dsmPtr;
  iVar1 = mriStep_AccessStepMem(arkode_mem,"mriStep_TakeStep",&ark_mem,step_mem_00);
  if (iVar1 != 0) {
    return iVar1;
  }
  uVar3 = extraout_RDX;
  if ((step_mem->NLS != (SUNNonlinearSolver)0x0) &&
     (step_mem->NLS->ops->setup != (_func_int_SUNNonlinearSolver_N_Vector_void_ptr *)0x0)) {
    N_VConst(0.0,ark_mem->tempv3);
    step_mem_01 = (char *)ark_mem->tempv3;
    iVar1 = SUNNonlinSolSetup(step_mem->NLS,(N_Vector)step_mem_01,ark_mem);
    if (iVar1 < 0) {
      return -0x1e;
    }
    uVar3 = extraout_RDX_00;
    if (iVar1 != 0) {
      return -0x1f;
    }
  }
  uVar4 = 1;
  do {
    if ((long)step_mem->stages <= (long)uVar4) {
      if (ark_mem->report != 0) {
        fprintf((FILE *)ark_mem->diagfp,"MRIStep  etest  %li  %.16g  %.16g\n",ark_mem->h,*local_40,
                ark_mem->nst);
      }
      return 0;
    }
    ark_mem->tcur = step_mem->MRIC->c[uVar4] * ark_mem->h + ark_mem->tn;
    iVar1 = (int)uVar4;
    if (ark_mem->report != 0) {
      step_mem_01 = "MRIStep  step  %li  %.16g  %i  %.16g\n";
      step_mem_00 = (ARKodeMRIStepMem *)(uVar4 & 0xffffffff);
      fprintf((FILE *)ark_mem->diagfp,"MRIStep  step  %li  %.16g  %i  %.16g\n",ark_mem->nst);
      uVar3 = extraout_RDX_01;
    }
    switch(step_mem->stagetypes[uVar4]) {
    case 0:
      step_mem_01 = (char *)step_mem;
      iVar1 = mriStep_StageERKFast(ark_mem,step_mem,iVar1);
      uVar3 = extraout_RDX_02;
      break;
    case 1:
      step_mem_01 = (char *)step_mem;
      iVar1 = mriStep_StageERKNoFast(ark_mem,step_mem,iVar1);
      uVar3 = extraout_RDX_04;
      break;
    case 2:
      step_mem_00 = (ARKodeMRIStepMem *)nflagPtr;
      step_mem_01 = (char *)step_mem;
      iVar1 = mriStep_StageDIRKNoFast(ark_mem,step_mem,iVar1,nflagPtr);
      uVar3 = extraout_RDX_03;
      break;
    case 3:
      mriStep_StageDIRKFast(ark_mem,(ARKodeMRIStepMem)step_mem_01,(int)uVar3,(int *)step_mem_00);
      return -0x29;
    default:
      goto switchD_003bd8a3_default;
    }
    if (iVar1 != 0) {
      return iVar1;
    }
switchD_003bd8a3_default:
    if (ark_mem->ProcessStage != (ARKPostProcessFn)0x0) {
      step_mem_01 = (char *)ark_mem->user_data;
      iVar1 = (*ark_mem->ProcessStage)(ark_mem->tcur,ark_mem->ycur,step_mem_01);
      uVar3 = extraout_RDX_05;
      if (iVar1 != 0) {
        return -0x26;
      }
    }
    if ((step_mem->stagetypes[uVar4] != 0) || (ark_mem->ProcessStage != (ARKPostProcessFn)0x0)) {
      step_mem_01 = (char *)ark_mem->ycur;
      iVar1 = mriStepInnerStepper_Reset(step_mem->stepper,ark_mem->tcur,(N_Vector)step_mem_01);
      uVar3 = extraout_RDX_06;
      if (iVar1 != 0) {
        return -0x22;
      }
    }
    if (((long)uVar4 < (long)step_mem->stages + -1) && (-1 < (long)step_mem->stage_map[uVar4])) {
      if (step_mem->explicit_rhs != 0) {
        step_mem_00 = (ARKodeMRIStepMem *)step_mem->Fse;
        step_mem_01 = (char *)step_mem_00[step_mem->stage_map[uVar4]];
        iVar1 = (*step_mem->fse)(ark_mem->tcur,ark_mem->ycur,(N_Vector)step_mem_01,
                                 ark_mem->user_data);
        step_mem->nfse = step_mem->nfse + 1;
        if (iVar1 < 0) {
          return -8;
        }
        uVar3 = extraout_RDX_07;
        if (iVar1 != 0) {
          return -0xb;
        }
      }
      if (step_mem->implicit_rhs != 0) {
        if (step_mem->deduce_rhs == 0) {
          piVar2 = step_mem->stage_map;
        }
        else {
          piVar2 = step_mem->stage_map;
          if (step_mem->stagetypes[uVar4] == 2) {
            step_mem_00 = (ARKodeMRIStepMem *)step_mem->Fsi;
            step_mem_01 = (char *)step_mem->sdata;
            N_VLinearSum(1.0 / step_mem->gamma,step_mem->zcor,-1.0 / step_mem->gamma,
                         (N_Vector)step_mem_01,(N_Vector)step_mem_00[piVar2[uVar4]]);
            uVar3 = extraout_RDX_08;
            goto LAB_003bda48;
          }
        }
        step_mem_00 = (ARKodeMRIStepMem *)step_mem->Fsi;
        step_mem_01 = (char *)step_mem_00[piVar2[uVar4]];
        iVar1 = (*step_mem->fsi)(ark_mem->tcur,ark_mem->ycur,(N_Vector)step_mem_01,
                                 ark_mem->user_data);
        step_mem->nfsi = step_mem->nfsi + 1;
        if (iVar1 < 0) {
          return -8;
        }
        uVar3 = extraout_RDX_09;
        if (iVar1 != 0) {
          return -0xb;
        }
      }
    }
LAB_003bda48:
    uVar4 = uVar4 + 1;
  } while( true );
}

Assistant:

int mriStep_TakeStep(void* arkode_mem, realtype *dsmPtr, int *nflagPtr)
{
  ARKodeMem ark_mem;           /* outer ARKode memory        */
  ARKodeMRIStepMem step_mem;   /* outer stepper memory       */
  int is;                      /* current stage index        */
  int retval;                  /* reusable return flag       */

  /* initialize algebraic solver convergence flag to success;
     error estimate to zero */
  *nflagPtr = ARK_SUCCESS;
  *dsmPtr = ZERO;

  /* access the MRIStep mem structure */
  retval = mriStep_AccessStepMem(arkode_mem, "mriStep_TakeStep",
                                 &ark_mem, &step_mem);
  if (retval != ARK_SUCCESS) return(retval);

#ifdef SUNDIALS_DEBUG
  printf("    MRIStep step %li,  stage 0,  h = %"RSYM",  t_n = %"RSYM"\n",
         ark_mem->nst, ark_mem->h, ark_mem->tcur);
#endif

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    MRIStep slow stage 0 solution:\n");
    N_VPrint(ark_mem->ycur);
    if (step_mem->explicit_rhs)
    {
      printf("    MRIStep slow stage RHS Fe[0]:\n");
      N_VPrint(step_mem->Fse[0]);
    }
    if (step_mem->implicit_rhs)
    {
      printf("    MRIStep slow stage RHS Fi[0]:\n");
      N_VPrint(step_mem->Fsi[0]);
    }
#endif

  /* call nonlinear solver setup if it exists */
  if (step_mem->NLS)
    if ((step_mem->NLS)->ops->setup) {
      N_VConst(ZERO, ark_mem->tempv3);   /* set guess to 0 for predictor-corrector form */
      retval = SUNNonlinSolSetup(step_mem->NLS, ark_mem->tempv3, ark_mem);
      if (retval < 0) return(ARK_NLS_SETUP_FAIL);
      if (retval > 0) return(ARK_NLS_SETUP_RECVR);
    }

  /* The first stage is the previous time-step solution, so its RHS
     is the [already-computed] slow RHS from the start of the step */

  /* Loop over remaining stages */
  for (is = 1; is < step_mem->stages; is++) {

    /* Set current stage time  */
    ark_mem->tcur = ark_mem->tn + step_mem->MRIC->c[is]*ark_mem->h;

#ifdef SUNDIALS_DEBUG
    printf("    ------------------------------------"
           "----------------------------------------\n");
    printf("    MRIStep step %li,  stage %i,  h = %"RSYM",  t_n = %"RSYM"\n",
           ark_mem->nst, is, ark_mem->h, ark_mem->tcur);
#endif

    /* Solver diagnostics reporting */
    if (ark_mem->report)
      fprintf(ark_mem->diagfp, "MRIStep  step  %li  %"RSYM"  %i  %"RSYM"\n",
              ark_mem->nst, ark_mem->h, is, ark_mem->tcur);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
    SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                       "ARKODE::mriStep_TakeStep", "start-step",
                       "step = %li, h = "RSYM", stage = %i, tcur = %"RSYM,
                       ark_mem->nst, ark_mem->h, is, ark_mem->tcur);
#endif

    /* Determine current stage type, and call corresponding routine; the
       vector ark_mem->ycur stores the previous stage solution on input, and
       should store the result of this stage solution on output. */
    switch (step_mem->stagetypes[is]) {
    case(MRISTAGE_ERK_FAST):
      retval = mriStep_StageERKFast(ark_mem, step_mem, is);
      break;
    case(MRISTAGE_ERK_NOFAST):
      retval = mriStep_StageERKNoFast(ark_mem, step_mem, is);
      break;
    case(MRISTAGE_DIRK_NOFAST):
      retval = mriStep_StageDIRKNoFast(ark_mem, step_mem, is, nflagPtr);
      break;
    case(MRISTAGE_DIRK_FAST):
      retval = mriStep_StageDIRKFast(ark_mem, step_mem, is, nflagPtr);
      break;
    }
    if (retval != ARK_SUCCESS)  return(retval);

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    MRIStep slow stage %i solution:\n",is);
    N_VPrint(ark_mem->ycur);
#endif

    /* apply user-supplied stage postprocessing function (if supplied) */
    if (ark_mem->ProcessStage != NULL) {
      retval = ark_mem->ProcessStage(ark_mem->tcur,
                                     ark_mem->ycur,
                                     ark_mem->user_data);
      if (retval != 0) return(ARK_POSTPROCESS_STAGE_FAIL);
    }

    /* conditionally reset the inner integrator with the modified stage solution */
    if ( (step_mem->stagetypes[is] != MRISTAGE_ERK_FAST) ||
         (ark_mem->ProcessStage != NULL) ) {
      retval = mriStepInnerStepper_Reset(step_mem->stepper,
                                         ark_mem->tcur, ark_mem->ycur);
      if (retval != ARK_SUCCESS)  return(ARK_INNERSTEP_FAIL);
    }

    /* Compute updated slow RHS except at last stage which is the new solution.
     * The new solution RHS evaluation happens in arkCompleteStep */
    if (is < step_mem->stages - 1 && step_mem->stage_map[is] > -1) {
      /* store explicit slow rhs */
      if (step_mem->explicit_rhs) {
        retval = step_mem->fse(ark_mem->tcur, ark_mem->ycur,
                               step_mem->Fse[step_mem->stage_map[is]],
                               ark_mem->user_data);
        step_mem->nfse++;
        if (retval < 0)  return(ARK_RHSFUNC_FAIL);
        if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);

#ifdef SUNDIALS_DEBUG_PRINTVEC
        printf("    MRIStep slow stage RHS Fe[%i]:\n",is);
        N_VPrint(step_mem->Fse[step_mem->stage_map[is]]);
#endif
      }

      /* store implicit slow rhs  */
      if (step_mem->implicit_rhs) {
        if (!step_mem->deduce_rhs ||
            (step_mem->stagetypes[is] != MRISTAGE_DIRK_NOFAST)) {
          retval = step_mem->fsi(ark_mem->tcur, ark_mem->ycur,
                                 step_mem->Fsi[step_mem->stage_map[is]],
                                 ark_mem->user_data);
          step_mem->nfsi++;
        } else {
          N_VLinearSum(ONE / step_mem->gamma, step_mem->zcor,
                       -ONE / step_mem->gamma, step_mem->sdata,
                       step_mem->Fsi[step_mem->stage_map[is]]);
        }

        if (retval < 0)  return(ARK_RHSFUNC_FAIL);
        if (retval > 0)  return(ARK_UNREC_RHSFUNC_ERR);

#ifdef SUNDIALS_DEBUG_PRINTVEC
        printf("    MRIStep slow stage RHS Fi[%i]:\n",is);
        N_VPrint(step_mem->Fsi[step_mem->stage_map[is]]);
#endif
      }
    } /* compute slow RHS */
  } /* loop over stages */

#ifdef SUNDIALS_DEBUG_PRINTVEC
    printf("    MRIStep updated solution:\n");
    N_VPrint(ark_mem->ycur);
#endif

  /* Solver diagnostics reporting */
  if (ark_mem->report)
    fprintf(ark_mem->diagfp, "MRIStep  etest  %li  %"RSYM"  %"RSYM"\n",
            ark_mem->nst, ark_mem->h, *dsmPtr);

#if SUNDIALS_LOGGING_LEVEL >= SUNDIALS_LOGGING_INFO
  SUNLogger_QueueMsg(ARK_LOGGER, SUN_LOGLEVEL_INFO,
                     "ARKODE::mriStep_TakeStep", "error-test",
                     "step = %li, h = "RSYM", dsm = %"RSYM,
                     ark_mem->nst, ark_mem->h, *dsmPtr);
#endif

  return(ARK_SUCCESS);
}